

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_ksdt.c
# Opt level: O3

void T_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = (double *)p->params;
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = 1e-08;
  if (1e-08 <= dVar2) {
    dVar3 = dVar2;
  }
  *pdVar1 = dVar3;
  return;
}

Assistant:

static void
T_set_ext_params(xc_func_type *p, const double *ext_params)
{
  lda_xc_ksdt_params *params;

  assert(p != NULL && p->params != NULL);
  params = (lda_xc_ksdt_params *) (p->params);

  /* the temperature is in units of k_B */
  params->T = get_ext_param(p, ext_params, 0);
  if(params->T < 1e-8) params->T = 1e-8;
}